

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

void google::SafeAppendString(char *source,char *dest,size_t dest_size)

{
  size_t sVar1;
  size_t dest_string_length;
  size_t dest_size_local;
  char *dest_local;
  char *source_local;
  
  sVar1 = strlen(dest);
  if (sVar1 < dest_size) {
    strncpy(dest + sVar1,source,dest_size - sVar1);
    (dest + sVar1)[(dest_size - sVar1) - 1] = '\0';
    return;
  }
  abort();
}

Assistant:

static void SafeAppendString(const char* source, char* dest, size_t dest_size) {
  size_t dest_string_length = strlen(dest);
  GLOG_SAFE_ASSERT(dest_string_length < dest_size);
  dest += dest_string_length;
  dest_size -= dest_string_length;
  strncpy(dest, source, dest_size);
  // Making sure |dest| is always null-terminated.
  dest[dest_size - 1] = '\0';
}